

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QRingChunk>::emplace<QRingChunk>
          (QMovableArrayOps<QRingChunk> *this,qsizetype i,QRingChunk *args)

{
  QRingChunk **ppQVar1;
  QRingChunk *pQVar2;
  Data *pDVar3;
  QRingChunk *pQVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  qsizetype *pqVar10;
  bool bVar11;
  
  pDVar3 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0012f1b7:
    pDVar5 = (args->chunk).d.d;
    pcVar6 = (args->chunk).d.ptr;
    (args->chunk).d.d = (Data *)0x0;
    (args->chunk).d.ptr = (char *)0x0;
    qVar7 = (args->chunk).d.size;
    (args->chunk).d.size = 0;
    qVar8 = args->headOffset;
    qVar9 = args->tailOffset;
    bVar11 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size !=
             0;
    QArrayDataPointer<QRingChunk>::detachAndGrow
              ((QArrayDataPointer<QRingChunk> *)this,(uint)(i == 0 && bVar11),1,(QRingChunk **)0x0,
               (QArrayDataPointer<QRingChunk> *)0x0);
    pQVar4 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
    if (i != 0 || !bVar11) {
      pQVar2 = pQVar4 + i;
      memmove(pQVar2 + 1,pQVar4 + i,
              ((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size -
              i) * 0x28);
      (pQVar2->chunk).d.d = pDVar5;
      (pQVar2->chunk).d.ptr = pcVar6;
      (pQVar2->chunk).d.size = qVar7;
      pQVar2->headOffset = qVar8;
      pQVar2->tailOffset = qVar9;
      goto LAB_0012f28c;
    }
    pQVar4[-1].chunk.d.d = pDVar5;
    pQVar4[-1].chunk.d.ptr = pcVar6;
    pQVar4[-1].chunk.d.size = qVar7;
    pQVar4[-1].headOffset = qVar8;
    pQVar4[-1].tailOffset = qVar9;
  }
  else {
    if (((this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size == i)
       && (pQVar4 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.
                    ptr,
          (pDVar3->super_QArrayData).alloc - i !=
          ((long)((long)pQVar4 -
                 ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3)
          * -0x3333333333333333)) {
      pDVar5 = (args->chunk).d.d;
      (args->chunk).d.d = (Data *)0x0;
      pQVar4[i].chunk.d.d = pDVar5;
      pcVar6 = (args->chunk).d.ptr;
      (args->chunk).d.ptr = (char *)0x0;
      pQVar4[i].chunk.d.ptr = pcVar6;
      qVar7 = (args->chunk).d.size;
      (args->chunk).d.size = 0;
      pQVar4[i].chunk.d.size = qVar7;
      qVar7 = args->tailOffset;
      pQVar4[i].headOffset = args->headOffset;
      (&pQVar4[i].headOffset)[1] = qVar7;
      goto LAB_0012f28c;
    }
    if ((i != 0) ||
       (pQVar4 = (this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr,
       (QRingChunk *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pQVar4)) goto LAB_0012f1b7;
    pDVar5 = (args->chunk).d.d;
    (args->chunk).d.d = (Data *)0x0;
    pQVar4[-1].chunk.d.d = pDVar5;
    pcVar6 = (args->chunk).d.ptr;
    (args->chunk).d.ptr = (char *)0x0;
    pQVar4[-1].chunk.d.ptr = pcVar6;
    qVar7 = (args->chunk).d.size;
    (args->chunk).d.size = 0;
    pQVar4[-1].chunk.d.size = qVar7;
    qVar7 = args->tailOffset;
    pQVar4[-1].headOffset = args->headOffset;
    pQVar4[-1].tailOffset = qVar7;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0012f28c:
  pqVar10 = &(this->super_QGenericArrayOps<QRingChunk>).super_QArrayDataPointer<QRingChunk>.size;
  *pqVar10 = *pqVar10 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }